

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereAddExplainText
               (Parse *pParse,int addr,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  uint uVar1;
  long lVar2;
  sqlite3 *db_00;
  long lVar3;
  VdbeOp *pVVar4;
  long lVar5;
  char *pcVar6;
  long in_RCX;
  long in_RDX;
  char *pcVar7;
  int in_ESI;
  char *in_RDI;
  ushort in_R8W;
  long in_FS_OFFSET;
  char *zRowid;
  char cRangeOp;
  Index *pIdx;
  char *zFmt;
  u32 flags;
  WhereLoop *pLoop;
  int isSearch;
  sqlite3 *db;
  SrcItem *pItem;
  VdbeOp *pOp;
  StrAccum str;
  char zBuf [100];
  StrAccum *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  bool bVar8;
  undefined1 uVar9;
  sqlite3_str *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  char cVar10;
  StrAccum *pStr;
  char *local_f8;
  sqlite3 *local_98;
  char *local_90;
  undefined1 *local_88;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar6 = in_RDI;
  if (*(long *)(in_RDI + 0xb0) != 0) {
    pcVar6 = *(char **)(in_RDI + 0xb0);
  }
  if (pcVar6[0x133] == '\x02') {
    pVVar4 = sqlite3VdbeGetOp(*(Vdbe **)(in_RDI + 0x10),in_ESI);
    lVar5 = in_RDX + 8 + (ulong)*(byte *)(in_RCX + 0x40) * 0x48;
    db_00 = *(sqlite3 **)in_RDI;
    local_98 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    memset(&stack0xffffffffffffff88,0xaa,100);
    if (db_00->mallocFailed == '\0') {
      lVar3 = *(long *)(in_RCX + 0x60);
      uVar1 = *(uint *)(lVar3 + 0x30);
      bVar8 = true;
      if (((uVar1 & 0x30) == 0) &&
         (((uVar1 & 0x400) != 0 || (bVar8 = true, *(short *)(lVar3 + 0x18) == 0)))) {
        bVar8 = (in_R8W & 3) != 0;
      }
      uVar9 = bVar8;
      sqlite3StrAccumInit((StrAccum *)&local_98,db_00,&stack0xffffffffffffff88,100,1000000000);
      pcVar7 = "SCAN";
      if (bVar8 != false) {
        pcVar7 = "SEARCH";
      }
      sqlite3_str_appendf((StrAccum *)&local_98,"%s %S",pcVar7,lVar5);
      if ((uVar1 & 0x500) == 0) {
        local_f8 = (char *)0x0;
        pStr = *(StrAccum **)(lVar3 + 0x20);
        if (((*(uint *)(*(long *)(lVar5 + 0x10) + 0x30) & 0x80) == 0) ||
           (((ulong)pStr[3].db & 0x3000000) != 0x2000000)) {
          if ((uVar1 & 0x20000) == 0) {
            if ((uVar1 & 0x4000) == 0) {
              if ((uVar1 & 0x4000040) == 0) {
                local_f8 = "INDEX %s";
              }
              else {
                local_f8 = "COVERING INDEX %s";
              }
            }
            else {
              local_f8 = "AUTOMATIC COVERING INDEX";
            }
          }
          else {
            local_f8 = "AUTOMATIC PARTIAL COVERING INDEX";
          }
        }
        else if (bVar8 != false) {
          local_f8 = "PRIMARY KEY";
        }
        if (local_f8 != (char *)0x0) {
          sqlite3_str_append((sqlite3_str *)CONCAT17(uVar9,in_stack_fffffffffffffee0),
                             (char *)in_stack_fffffffffffffed8,0);
          sqlite3_str_appendf((StrAccum *)&local_98,local_f8,pStr->db);
          explainIndexRange(pStr,(WhereLoop *)
                                 CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        }
      }
      else if (((uVar1 & 0x100) == 0) || ((uVar1 & 0xf) == 0)) {
        if ((uVar1 & 0x400) != 0) {
          sqlite3_str_appendall(in_stack_fffffffffffffef0,pcVar6);
          pcVar6 = "%d:%s";
          if ((*(byte *)(lVar3 + 0x1c) >> 2 & 1) != 0) {
            pcVar6 = "0x%x:%s";
          }
          sqlite3_str_appendf((StrAccum *)&local_98,pcVar6,(ulong)*(uint *)(lVar3 + 0x18),
                              *(undefined8 *)(lVar3 + 0x20));
        }
      }
      else {
        pcVar6 = "rowid";
        sqlite3_str_appendf((StrAccum *)&local_98," USING INTEGER PRIMARY KEY (%s","rowid");
        if ((uVar1 & 5) == 0) {
          if ((uVar1 & 0x30) == 0x30) {
            sqlite3_str_appendf((StrAccum *)&local_98,">? AND %s",pcVar6);
            cVar10 = '<';
          }
          else if ((uVar1 & 0x20) == 0) {
            cVar10 = '<';
          }
          else {
            cVar10 = '>';
          }
        }
        else {
          cVar10 = '=';
        }
        sqlite3_str_appendf((StrAccum *)&local_98,"%c?)",(ulong)(uint)(int)cVar10);
      }
      if ((*(byte *)(lVar5 + 0x18) & 8) != 0) {
        sqlite3_str_appendf((StrAccum *)&local_98," LEFT-JOIN");
      }
      sqlite3DbFree((sqlite3 *)CONCAT17(uVar9,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
      pVVar4->p4type = -6;
      pcVar6 = sqlite3StrAccumFinish(in_stack_fffffffffffffed8);
      (pVVar4->p4).z = pcVar6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereAddExplainText(
  Parse *pParse,                  /* Parse context */
  int addr,                       /* Address of OP_Explain opcode */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
#if !defined(SQLITE_DEBUG)
  if( sqlite3ParseToplevel(pParse)->explain==2 || IS_STMT_SCANSTATUS(pParse->db) )
#endif
  {
    VdbeOp *pOp = sqlite3VdbeGetOp(pParse->pVdbe, addr);

    SrcItem *pItem = &pTabList->a[pLevel->iFrom];
    sqlite3 *db = pParse->db;     /* Database handle */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */
    WhereLoop *pLoop;             /* The controlling WhereLoop object */
    u32 flags;                    /* Flags that describe this loop */
#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_EXPLAIN)
    char *zMsg;                   /* Text to add to EQP output */
#endif
    StrAccum str;                 /* EQP output string */
    char zBuf[100];               /* Initial space for EQP output string */

    if( db->mallocFailed ) return;

    pLoop = pLevel->pWLoop;
    flags = pLoop->wsFlags;

    isSearch = (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
            || ((flags&WHERE_VIRTUALTABLE)==0 && (pLoop->u.btree.nEq>0))
            || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
    str.printfFlags = SQLITE_PRINTF_INTERNAL;
    sqlite3_str_appendf(&str, "%s %S", isSearch ? "SEARCH" : "SCAN", pItem);
    if( (flags & (WHERE_IPK|WHERE_VIRTUALTABLE))==0 ){
      const char *zFmt = 0;
      Index *pIdx;

      assert( pLoop->u.btree.pIndex!=0 );
      pIdx = pLoop->u.btree.pIndex;
      assert( !(flags&WHERE_AUTO_INDEX) || (flags&WHERE_IDX_ONLY) );
      if( !HasRowid(pItem->pSTab) && IsPrimaryKeyIndex(pIdx) ){
        if( isSearch ){
          zFmt = "PRIMARY KEY";
        }
      }else if( flags & WHERE_PARTIALIDX ){
        zFmt = "AUTOMATIC PARTIAL COVERING INDEX";
      }else if( flags & WHERE_AUTO_INDEX ){
        zFmt = "AUTOMATIC COVERING INDEX";
      }else if( flags & (WHERE_IDX_ONLY|WHERE_EXPRIDX) ){
        zFmt = "COVERING INDEX %s";
      }else{
        zFmt = "INDEX %s";
      }
      if( zFmt ){
        sqlite3_str_append(&str, " USING ", 7);
        sqlite3_str_appendf(&str, zFmt, pIdx->zName);
        explainIndexRange(&str, pLoop);
      }
    }else if( (flags & WHERE_IPK)!=0 && (flags & WHERE_CONSTRAINT)!=0 ){
      char cRangeOp;
#if 0  /* Better output, but breaks many tests */
      const Table *pTab = pItem->pTab;
      const char *zRowid = pTab->iPKey>=0 ? pTab->aCol[pTab->iPKey].zCnName:
                              "rowid";
#else
      const char *zRowid = "rowid";
#endif
      sqlite3_str_appendf(&str, " USING INTEGER PRIMARY KEY (%s", zRowid);
      if( flags&(WHERE_COLUMN_EQ|WHERE_COLUMN_IN) ){
        cRangeOp = '=';
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        sqlite3_str_appendf(&str, ">? AND %s", zRowid);
        cRangeOp = '<';
      }else if( flags&WHERE_BTM_LIMIT ){
        cRangeOp = '>';
      }else{
        assert( flags&WHERE_TOP_LIMIT);
        cRangeOp = '<';
      }
      sqlite3_str_appendf(&str, "%c?)", cRangeOp);
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_str_appendall(&str, " VIRTUAL TABLE INDEX ");
      sqlite3_str_appendf(&str,
                  pLoop->u.vtab.bIdxNumHex ? "0x%x:%s" : "%d:%s",
                  pLoop->u.vtab.idxNum, pLoop->u.vtab.idxStr);
    }
#endif
    if( pItem->fg.jointype & JT_LEFT ){
      sqlite3_str_appendf(&str, " LEFT-JOIN");
    }
#ifdef SQLITE_EXPLAIN_ESTIMATED_ROWS
    if( pLoop->nOut>=10 ){
      sqlite3_str_appendf(&str, " (~%llu rows)",
             sqlite3LogEstToInt(pLoop->nOut));
    }else{
      sqlite3_str_append(&str, " (~1 row)", 9);
    }
#endif
#if defined(SQLITE_DEBUG) && !defined(SQLITE_OMIT_EXPLAIN)
    zMsg = sqlite3StrAccumFinish(&str);
    sqlite3ExplainBreakpoint("",zMsg);
#endif

    assert( pOp->opcode==OP_Explain );
    assert( pOp->p4type==P4_DYNAMIC || pOp->p4.z==0 );
    sqlite3DbFree(db, pOp->p4.z);
    pOp->p4type = P4_DYNAMIC;
    pOp->p4.z = sqlite3StrAccumFinish(&str);
  }
}